

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

void __thiscall tcmalloc::GenericWriter::AppendF(GenericWriter *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  int *piVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  int local_7c [3];
  va_list va_1;
  pair<char_*,_char_*> local_50;
  int local_3c [2];
  int written;
  va_list va;
  int space_left;
  char *fmt_local;
  GenericWriter *this_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  va[0].reg_save_area._4_4_ = (int)this->buf_end_ - (int)this->buf_fill_;
  va[0].overflow_arg_area = local_138;
  va[0]._0_8_ = &stack0x00000008;
  written = 0x30;
  local_3c[1] = 0x10;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_3c[0] = vsnprintf(this->buf_fill_,(long)va[0].reg_save_area._4_4_,fmt,local_3c + 1);
  if (va[0].reg_save_area._4_4_ <= local_3c[0]) {
    iVar1 = (*this->_vptr_GenericWriter[2])
                      (this,this->buf_,this->buf_fill_,(ulong)(local_3c[0] + 1));
    local_50.first = (char *)CONCAT44(extraout_var,iVar1);
    std::tie<char*,char*>((char **)&va_1[0].reg_save_area,&this->buf_);
    std::tuple<char*&,char*&>::operator=((tuple<char*&,char*&> *)&va_1[0].reg_save_area,&local_50);
    this->buf_fill_ = this->buf_;
    va_1[0].overflow_arg_area = local_138;
    va_1[0]._0_8_ = &stack0x00000008;
    local_7c[2] = 0x30;
    local_7c[1] = 0x10;
    va[0].reg_save_area._4_4_ = (int)this->buf_end_ - (int)this->buf_;
    local_3c[0] = vsnprintf(this->buf_,(long)va[0].reg_save_area._4_4_,fmt,local_7c + 1);
    local_7c[0] = va[0].reg_save_area._4_4_ + -1;
    piVar2 = std::min<int>(local_3c,local_7c);
    local_3c[0] = *piVar2;
  }
  this->buf_fill_ = this->buf_fill_ + local_3c[0];
  return;
}

Assistant:

void GenericWriter::AppendF(const char* fmt, ...) {
  int space_left = buf_end_ - buf_fill_;

  va_list va;
  va_start(va, fmt);
  int written = vsnprintf(buf_fill_, space_left, fmt, va);
  va_end(va);

  if (PREDICT_FALSE(written >= space_left)) {
    std::tie(buf_, buf_end_) = RecycleBuffer(buf_, buf_fill_, written + 1);
    RAW_DCHECK(written < buf_end_ - buf_, "recycled buffer needs to have space for this append");
    buf_fill_ = buf_;

    va_list va;
    va_start(va, fmt);
    space_left = buf_end_ - buf_;
    written = vsnprintf(buf_, space_left, fmt, va);
    va_end(va);

    RAW_DCHECK(written < space_left, "");
    // In case condition above holds (which we only test in debug builds)
    written = std::min<int>(written, space_left - 1);
  }

  buf_fill_ += written;
}